

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spoa_test.cpp
# Opt level: O3

void __thiscall spoa::test::SpoaTest_Local_Test::TestBody(SpoaTest_Local_Test *this)

{
  string c;
  
  SpoaTest::Initialize(&this->super_SpoaTest,kSW,'\x05',-4,-8,-8,-8,-8,false);
  SpoaTest::Align(&this->super_SpoaTest);
  c._M_dataplus._M_p = (pointer)&c.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&c,
             "AATGATGCGCTTTGTTGGCGCGGTGGCTTGATGCAGGGGCTAATCGACCTCTGGCAACCACTTTTCCATGACAGGAGTTGAATATGGCATTCAGTAATCCCTTCGATGATCCGCAGGGAGCGTTTTACATATTGCGCAATGCGCAGGGGCAATTCAGTCTGTGGCCGCAACAATGCGTCTTACCGGCAGGCTGGGACATTGTGTGTCAGCCGCAGTCACAGGCGTCCTGCCAGCAGTGGCTGGAAGCCCACTGGCGTACTCTGACACCGACGAATTTTACCCAGTTGCAGGAGGCACAATGAGCCAGCATTTACCTTTGGTCGCCGCACAGCCCGGCATCTGGATGGCAGAAAAACTGTCAGAATTACCCTCCGCCTGGAGCGTGGCGCATTACGTTGAGTTAACCGGAGAGGTTGATTCGCCATTACTGGCCCGCGCGGTGGTTGCCGGACTAGCGCAAGCAGATACGCTTTACACGCGCAACCAAGGATTTCGG"
             ,"");
  SpoaTest::Check(&this->super_SpoaTest,&c);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)c._M_dataplus._M_p != &c.field_2) {
    operator_delete(c._M_dataplus._M_p,c.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

TEST_F(SpoaTest, Local) {
  Initialize(AlignmentType::kSW, 5, -4, -8, -8, -8, -8, false);
  Align();

  std::string c =
      "AATGATGCGCTTTGTTGGCGCGGTGGCTTGATGCAGGGGCTAATCGACCTCTGGCAACCACTTTTCCATGAC"
      "AGGAGTTGAATATGGCATTCAGTAATCCCTTCGATGATCCGCAGGGAGCGTTTTACATATTGCGCAATGCGC"
      "AGGGGCAATTCAGTCTGTGGCCGCAACAATGCGTCTTACCGGCAGGCTGGGACATTGTGTGTCAGCCGCAGT"
      "CACAGGCGTCCTGCCAGCAGTGGCTGGAAGCCCACTGGCGTACTCTGACACCGACGAATTTTACCCAGTTGC"
      "AGGAGGCACAATGAGCCAGCATTTACCTTTGGTCGCCGCACAGCCCGGCATCTGGATGGCAGAAAAACTGTC"
      "AGAATTACCCTCCGCCTGGAGCGTGGCGCATTACGTTGAGTTAACCGGAGAGGTTGATTCGCCATTACTGGC"
      "CCGCGCGGTGGTTGCCGGACTAGCGCAAGCAGATACGCTTTACACGCGCAACCAAGGATTTCGG";

  Check(c);
}